

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::ComputeTargetObjectDirectory
          (cmGlobalGhsMultiGenerator *this,cmGeneratorTarget *gt)

{
  string *a;
  char local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  char local_39;
  undefined1 local_38 [8];
  string dir;
  cmGeneratorTarget *gt_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  dir.field_2._8_8_ = gt;
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(gt->LocalGenerator);
  local_39 = '/';
  (**(code **)(**(long **)(dir.field_2._8_8_ + 0x10) + 0x80))();
  local_61 = '/';
  cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string,char>
            ((string *)local_38,a,&local_39,&local_60,&local_61);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::operator=((string *)(dir.field_2._8_8_ + 0x20),(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::ComputeTargetObjectDirectory(
  cmGeneratorTarget* gt) const
{
  // Compute full path to object file directory for this target.
  std::string dir =
    cmStrCat(gt->LocalGenerator->GetCurrentBinaryDirectory(), '/',
             gt->LocalGenerator->GetTargetDirectory(gt), '/');
  gt->ObjectDirectory = dir;
}